

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

ComponentHandle<Counter,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Counter,Counter_const&>(EntityManager *this,Id id,Counter *args)

{
  ulong *puVar1;
  ComponentHandle<Counter,_entityx::EntityManager> CVar2;
  Family FVar3;
  Pool<Counter,_8192UL> *pPVar4;
  ulong uVar5;
  ComponentHandle<Counter,_entityx::EntityManager> component;
  Entity local_40;
  ComponentHandle<Counter,_entityx::EntityManager> local_30;
  
  FVar3 = Component<Counter>::family();
  pPVar4 = accomodate_component<Counter>(this);
  uVar5 = id.id_ & 0xffffffff;
  *(int *)(*(long *)(*(long *)&pPVar4->field_0x8 + (uVar5 / *(ulong *)&pPVar4->field_0x28) * 8) +
          (uVar5 % *(ulong *)&pPVar4->field_0x28) * *(long *)&pPVar4->field_0x20) = args->counter;
  if (FVar3 < 0x40) {
    puVar1 = (ulong *)(*(long *)(this + 0x48) + uVar5 * 8);
    *puVar1 = *puVar1 | 1L << ((byte)FVar3 & 0x3f);
    local_40.manager_ = this;
    local_40.id_.id_ = id.id_;
    local_30.manager_ = this;
    local_30.id_.id_ = id.id_;
    EventManager::
    emit<entityx::ComponentAddedEvent<Counter>,entityx::Entity,entityx::ComponentHandle<Counter,entityx::EntityManager>&>
              (*(EventManager **)(this + 0x10),&local_40,&local_30);
    CVar2.id_.id_ = local_30.id_.id_;
    CVar2.manager_ = local_30.manager_;
    return CVar2;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar3,0x40);
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }